

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifMan.c
# Opt level: O2

If_Obj_t * If_ManSetupObj(If_Man_t *p)

{
  Vec_Ptr_t *p_00;
  If_Obj_t *Entry;
  
  Entry = (If_Obj_t *)Mem_FixedEntryFetch(p->pMemObj);
  *(undefined8 *)Entry = 0;
  Entry->IdPio = 0;
  Entry->nRefs = 0;
  Entry->nVisits = 0;
  Entry->nVisitsCopy = 0;
  Entry->pFanin0 = (If_Obj_t *)0x0;
  Entry->pFanin1 = (If_Obj_t *)0x0;
  Entry->pEquiv = (If_Obj_t *)0x0;
  Entry->EstRefs = 0.0;
  Entry->Required = 0.0;
  *(undefined8 *)&Entry->LValue = 0;
  (Entry->field_22).pCopy = (void *)0x0;
  Entry->pCutSet = (If_Set_t *)0x0;
  (Entry->CutBest).Area = 0.0;
  (Entry->CutBest).Edge = 0.0;
  (Entry->CutBest).Power = 0.0;
  (Entry->CutBest).Delay = 0.0;
  (Entry->CutBest).iCutFunc = 0;
  (Entry->CutBest).uMaskFunc = 0;
  *(undefined8 *)&(Entry->CutBest).uSign = 0;
  If_CutSetup(p,&Entry->CutBest);
  p_00 = p->vObjs;
  Entry->Id = p_00->nSize;
  Vec_PtrPush(p_00,Entry);
  Entry->Required = 1e+20;
  return Entry;
}

Assistant:

If_Obj_t * If_ManSetupObj( If_Man_t * p )
{
    If_Obj_t * pObj;
    // get memory for the object
    pObj = (If_Obj_t *)Mem_FixedEntryFetch( p->pMemObj );
    memset( pObj, 0, sizeof(If_Obj_t) );
    If_CutSetup( p, &pObj->CutBest );
    // assign ID and save 
    pObj->Id = Vec_PtrSize(p->vObjs);
    Vec_PtrPush( p->vObjs, pObj );
    // set the required times
    pObj->Required = IF_FLOAT_LARGE;
    return pObj;
}